

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O1

shared_ptr<Rml::Transform> __thiscall
Rml::Property::Get<std::shared_ptr<Rml::Transform>>(Property *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Variant *in_RSI;
  shared_ptr<Rml::Transform> sVar1;
  shared_ptr<Rml::Transform> local_18;
  
  local_18.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_18.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Variant::GetInto<std::shared_ptr<Rml::Transform>,_0>(in_RSI,&local_18);
  (this->value).type =
       (Type)local_18.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->value).data[0] = '\0';
  (this->value).data[1] = '\0';
  (this->value).data[2] = '\0';
  (this->value).data[3] = '\0';
  (this->value).data[4] = '\0';
  (this->value).data[5] = '\0';
  (this->value).data[6] = '\0';
  (this->value).data[7] = '\0';
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this->value).data =
       local_18.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  sVar1.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<Rml::Transform>)
         sVar1.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

T Get() const
	{
		return value.Get<T>();
	}